

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O2

wchar_t assertion_make_symlink
                  (char *file,wchar_t line,char *newpath,char *linkto,wchar_t targetIsDir)

{
  int iVar1;
  char *extra;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  iVar1 = symlink(linkto,newpath);
  if (iVar1 != 0) {
    failure_start(file,line,"Could not create symlink");
    logprintf("   New link: %s\n",newpath);
    extra = "   Old name: %s\n";
    logprintf("   Old name: %s\n",linkto);
    failure_finish(extra);
  }
  return (uint)(iVar1 == 0);
}

Assistant:

int
assertion_make_symlink(const char *file, int line,
    const char *newpath, const char *linkto, int targetIsDir)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	assertion_count(file, line);
	if (my_CreateSymbolicLinkA(newpath, linkto, targetIsDir))
		return (1);
#elif HAVE_SYMLINK
	(void)targetIsDir; /* UNUSED */
	assertion_count(file, line);
	if (0 == symlink(linkto, newpath))
		return (1);
#else
	(void)targetIsDir; /* UNUSED */
#endif
	failure_start(file, line, "Could not create symlink");
	logprintf("   New link: %s\n", newpath);
	logprintf("   Old name: %s\n", linkto);
	failure_finish(NULL);
	return(0);
}